

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
GIM_ShapeRetriever::GIM_ShapeRetriever(GIM_ShapeRetriever *this,cbtGImpactShapeInterface *gim_shape)

{
  int iVar1;
  ChildShapeRetriever *pCVar2;
  
  cbtTriangleShapeEx::cbtTriangleShapeEx(&this->m_trishape);
  cbtTetrahedronShapeEx::cbtTetrahedronShapeEx(&this->m_tetrashape);
  (this->m_child_retriever)._vptr_ChildShapeRetriever = (_func_int **)&PTR_getChildShape_011982c8;
  (this->m_tri_retriever).super_ChildShapeRetriever._vptr_ChildShapeRetriever =
       (_func_int **)&PTR_getChildShape_01198300;
  (this->m_tetra_retriever).super_ChildShapeRetriever._vptr_ChildShapeRetriever =
       (_func_int **)&PTR_getChildShape_01198340;
  this->m_gim_shape = gim_shape;
  iVar1 = (*(gim_shape->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x18]
          )(gim_shape);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(this->m_gim_shape->super_cbtConcaveShape).super_cbtCollisionShape.
              _vptr_cbtCollisionShape[0x19])();
    if ((char)iVar1 == '\0') {
      pCVar2 = &this->m_child_retriever;
    }
    else {
      pCVar2 = &(this->m_tetra_retriever).super_ChildShapeRetriever;
    }
  }
  else {
    pCVar2 = &(this->m_tri_retriever).super_ChildShapeRetriever;
  }
  this->m_current_retriever = pCVar2;
  pCVar2->m_parent = this;
  return;
}

Assistant:

GIM_ShapeRetriever(const cbtGImpactShapeInterface* gim_shape)
	{
		m_gim_shape = gim_shape;
		//select retriever
		if (m_gim_shape->needsRetrieveTriangles())
		{
			m_current_retriever = &m_tri_retriever;
		}
		else if (m_gim_shape->needsRetrieveTetrahedrons())
		{
			m_current_retriever = &m_tetra_retriever;
		}
		else
		{
			m_current_retriever = &m_child_retriever;
		}

		m_current_retriever->m_parent = this;
	}